

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

void __thiscall World::AdminRequest(World *this,Character *from,string *message)

{
  World *pWVar1;
  bool bVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  mapped_type *pmVar7;
  long lVar8;
  long lVar9;
  reference ppCVar10;
  size_type sVar11;
  reference ppBVar12;
  Board_Post *this_00;
  double dVar13;
  allocator<char> local_2d9;
  key_type local_2d8;
  string local_2b8;
  string local_298;
  allocator<char> local_271;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210 [32];
  Board_Post *local_1f0;
  Board_Post *newpost;
  Board *admin_board;
  key_type local_1d8;
  short local_1b4;
  allocator<char> local_1b1;
  undefined1 local_1b0 [4];
  short boardid;
  Character *local_190;
  Character *character;
  iterator __end1;
  iterator __begin1;
  vector<Character_*,_std::allocator<Character_*>_> *__range1;
  string local_150 [32];
  undefined1 local_130 [8];
  PacketBuilder builder;
  string local_f8;
  string local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  allocator<char> local_61;
  key_type local_60;
  string local_40;
  string *local_20;
  string *message_local;
  Character *from_local;
  World *this_local;
  
  local_20 = message;
  message_local = (string *)from;
  from_local = (Character *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"ChatMaxWidth",&local_61);
  pmVar7 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_60);
  iVar4 = util::variant::operator_cast_to_int(pmVar7);
  (**(code **)(*(long *)message_local + 0x10))(&local_d8);
  util::ucfirst(&local_b8,&local_d8);
  std::operator+(&local_98,&local_b8,"  needs help: ");
  iVar5 = util::text_width(&local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"...",(allocator<char> *)((long)&builder.add_size + 7));
  util::text_cap(&local_40,message,iVar4 - iVar5,&local_f8);
  std::__cxx11::string::operator=((string *)message,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&builder.add_size + 7));
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  (**(code **)(*(long *)message_local + 0x10))();
  lVar8 = std::__cxx11::string::length();
  lVar9 = std::__cxx11::string::length();
  PacketBuilder::PacketBuilder
            ((PacketBuilder *)local_130,PACKET_ADMININTERACT,PACKET_REPLY,lVar8 + 4 + lVar9);
  std::__cxx11::string::~string(local_150);
  PacketBuilder::AddChar((PacketBuilder *)local_130,1);
  PacketBuilder::AddByte((PacketBuilder *)local_130,0xff);
  (**(code **)(*(long *)message_local + 0x10))(&__range1);
  PacketBuilder::AddBreakString((PacketBuilder *)local_130,(string *)&__range1,0xff);
  std::__cxx11::string::~string((string *)&__range1);
  PacketBuilder::AddBreakString((PacketBuilder *)local_130,message,0xff);
  __end1 = std::vector<Character_*,_std::allocator<Character_*>_>::begin(&this->characters);
  character = (Character *)
              std::vector<Character_*,_std::allocator<Character_*>_>::end(&this->characters);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                                     *)&character), bVar2) {
    ppCVar10 = __gnu_cxx::
               __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
               ::operator*(&__end1);
    local_190 = *ppCVar10;
    uVar6 = (**(local_190->super_Command_Source)._vptr_Command_Source)();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_1b0,"reports",&local_1b1);
    pmVar7 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(this->admin_config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,(key_type *)local_1b0);
    iVar4 = util::variant::operator_cast_to_int(pmVar7);
    std::__cxx11::string::~string((string *)local_1b0);
    std::allocator<char>::~allocator(&local_1b1);
    if (iVar4 <= (int)(uVar6 & 0xff)) {
      Character::Send(local_190,(PacketBuilder *)local_130);
    }
    __gnu_cxx::
    __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>::
    operator++(&__end1);
  }
  pWVar1 = this->server->world;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"AdminBoard",(allocator<char> *)((long)&admin_board + 7));
  pmVar7 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar1->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_1d8);
  iVar4 = util::variant::operator_cast_to_int(pmVar7);
  sVar3 = (short)iVar4 + -1;
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&admin_board + 7));
  local_1b4 = sVar3;
  sVar11 = std::array<Board_*,_8UL>::size(&this->server->world->boards);
  if ((ulong)(long)sVar3 < sVar11) {
    ppBVar12 = std::array<Board_*,_8UL>::operator[](&this->server->world->boards,(long)local_1b4);
    newpost = (Board_Post *)*ppBVar12;
    this_00 = (Board_Post *)operator_new(0x78);
    Board_Post::Board_Post(this_00);
    sVar3 = (short)*(undefined4 *)&newpost->field_0x4 + 1;
    *(short *)&newpost->field_0x4 = sVar3;
    this_00->id = sVar3;
    local_1f0 = this_00;
    (**(code **)(*(long *)message_local + 0x10))(local_210);
    std::__cxx11::string::operator=((string *)&local_1f0->author,local_210);
    std::__cxx11::string::~string(local_210);
    local_1f0->author_admin = (uint)(byte)(message_local->field_2)._M_local_buf[4];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270," [Request] ",&local_271);
    (**(code **)(*(long *)message_local + 0x10))(&local_2b8);
    util::ucfirst(&local_298,&local_2b8);
    std::operator+(&local_250,&local_270,&local_298);
    std::operator+(&local_230,&local_250," needs help");
    std::__cxx11::string::operator=((string *)&local_1f0->subject,(string *)&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator(&local_271);
    std::__cxx11::string::operator=((string *)&local_1f0->body,(string *)message);
    dVar13 = Timer::GetTime();
    local_1f0->time = dVar13;
    std::__cxx11::list<Board_Post_*,_std::allocator<Board_Post_*>_>::push_front
              ((list<Board_Post_*,_std::allocator<Board_Post_*>_> *)&newpost->author,&local_1f0);
    sVar11 = std::__cxx11::list<Board_Post_*,_std::allocator<Board_Post_*>_>::size
                       ((list<Board_Post_*,_std::allocator<Board_Post_*>_> *)&newpost->author);
    pWVar1 = this->server->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d8,"AdminBoardLimit",&local_2d9);
    pmVar7 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(pWVar1->config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,&local_2d8);
    iVar4 = util::variant::operator_cast_to_int(pmVar7);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::allocator<char>::~allocator(&local_2d9);
    if ((ulong)(long)iVar4 < sVar11) {
      std::__cxx11::list<Board_Post_*,_std::allocator<Board_Post_*>_>::pop_back
                ((list<Board_Post_*,_std::allocator<Board_Post_*>_> *)&newpost->author);
    }
  }
  PacketBuilder::~PacketBuilder((PacketBuilder *)local_130);
  return;
}

Assistant:

void World::AdminRequest(Character *from, std::string message)
{
	message = util::text_cap(message, static_cast<int>(this->config["ChatMaxWidth"]) - util::text_width(util::ucfirst(from->SourceName()) + "  needs help: "));

	PacketBuilder builder(PACKET_ADMININTERACT, PACKET_REPLY, 4 + from->SourceName().length() + message.length());
	builder.AddChar(1); // message type
	builder.AddByte(255);
	builder.AddBreakString(from->SourceName());
	builder.AddBreakString(message);

	UTIL_FOREACH(this->characters, character)
	{
		if (character->SourceAccess() >= static_cast<int>(this->admin_config["reports"]))
		{
			character->Send(builder);
		}
	}

	short boardid = static_cast<int>(this->server->world->config["AdminBoard"]) - 1;

	if (static_cast<std::size_t>(boardid) < this->server->world->boards.size())
	{
		Board *admin_board = this->server->world->boards[boardid];

		Board_Post *newpost = new Board_Post;
		newpost->id = ++admin_board->last_id;
		newpost->author = from->SourceName();
		newpost->author_admin = from->admin;
		newpost->subject = std::string(" [Request] ") + util::ucfirst(from->SourceName()) + " needs help";
		newpost->body = message;
		newpost->time = Timer::GetTime();

		admin_board->posts.push_front(newpost);

		if (admin_board->posts.size() > static_cast<std::size_t>(static_cast<int>(this->server->world->config["AdminBoardLimit"])))
		{
			admin_board->posts.pop_back();
		}
	}
}